

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getColIntegrality(Highs *this,HighsInt col,HighsVarType *integrality)

{
  pointer pHVar1;
  
  if (col < 0 || (this->model_).lp_.num_col_ <= col) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Index %d for column integrality is outside the range [0, num_col = %d)\n");
  }
  else {
    pHVar1 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(uint)col <
        (ulong)((long)(this->model_).lp_.integrality_.
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pHVar1)) {
      *integrality = pHVar1[(uint)col];
      return kOk;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model integrality does not exist for index %d\n");
  }
  return kError;
}

Assistant:

HighsStatus Highs::getColIntegrality(const HighsInt col,
                                     HighsVarType& integrality) const {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Index %d for column integrality is outside the range [0, "
                 "num_col = %d)\n",
                 int(col), int(num_col));
    return HighsStatus::kError;
  }
  if (static_cast<size_t>(col) < this->model_.lp_.integrality_.size()) {
    integrality = this->model_.lp_.integrality_[col];
    return HighsStatus::kOk;
  } else {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model integrality does not exist for index %d\n", int(col));
    return HighsStatus::kError;
  }
}